

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pic_is4(stbi__context *s,char *str)

{
  stbi_uc sVar1;
  long in_RSI;
  int i;
  stbi__context *in_stack_ffffffffffffffd8;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (3 < local_1c) {
      return 1;
    }
    sVar1 = stbi__get8(in_stack_ffffffffffffffd8);
    if (sVar1 != *(stbi_uc *)(in_RSI + local_1c)) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

static int stbi__pic_is4(stbi__context *s,const char *str)
{
   int i;
   for (i=0; i<4; ++i)
      if (stbi__get8(s) != (stbi_uc)str[i])
         return 0;

   return 1;
}